

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDHash::Read(ON_SubDHash *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON_SubDHashType OVar2;
  bool bVar3;
  long lVar4;
  ON_SubDHash *pOVar5;
  ON_SubDHash *pOVar6;
  uchar hash_type_as_unsigned;
  bool bIsEmpty;
  int chunk_version;
  
  pOVar5 = &Empty;
  pOVar6 = this;
  for (lVar4 = 0x5c; lVar4 != 0; lVar4 = lVar4 + -1) {
    pOVar6->m_hash_type = pOVar5->m_hash_type;
    pOVar5 = (ON_SubDHash *)&pOVar5->field_0x1;
    pOVar6 = (ON_SubDHash *)&pOVar6->field_0x1;
  }
  chunk_version = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&chunk_version);
  if (!bVar1) {
    return false;
  }
  bIsEmpty = true;
  bVar1 = ON_BinaryArchive::ReadBool(archive,&bIsEmpty);
  if (bVar1) {
    bVar1 = true;
    if (bIsEmpty != false) goto LAB_005db03e;
    hash_type_as_unsigned = '\0';
    bVar1 = ON_BinaryArchive::ReadChar(archive,&hash_type_as_unsigned);
    if (bVar1) {
      OVar2 = ON_SubDHashTypeFromUnsigned((uint)hash_type_as_unsigned);
      this->m_hash_type = OVar2;
      bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_vertex_count);
      if ((((bVar1) && (bVar1 = ON_SHA1_Hash::Read(&this->m_vertex_hash,archive), bVar1)) &&
          (bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_edge_count), bVar1)) &&
         ((bVar1 = ON_SHA1_Hash::Read(&this->m_edge_hash,archive), bVar1 &&
          (bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_face_count), bVar1)))) {
        bVar1 = ON_SHA1_Hash::Read(&this->m_face_hash,archive);
        goto LAB_005db03e;
      }
    }
  }
  bVar1 = false;
LAB_005db03e:
  bVar3 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar3 & bVar1);
}

Assistant:

bool ON_SubDHash::Read(class ON_BinaryArchive& archive)
{
  *this = ON_SubDHash::Empty;

  int chunk_version = 0;
  if (false == archive.BeginRead3dmAnonymousChunk(&chunk_version))
    return false;

  bool rc = false;
  for (;;)
  {
    bool bIsEmpty = true;
    if (false == archive.ReadBool(&bIsEmpty))
      break;
    if (bIsEmpty)
    {
      rc = true;
      break;
    }

    // The SubD runtime serial number and geometry content serial numbers are runtime values.
    // When appropriate, calling contexts need to set these after reading.
    unsigned char hash_type_as_unsigned = 0;
    if (false == archive.ReadChar(&hash_type_as_unsigned))
      break;
    m_hash_type = ON_SubDHashTypeFromUnsigned(hash_type_as_unsigned);

    if (false == archive.ReadInt(&m_vertex_count))
      break;
    if (false == this->m_vertex_hash.Read(archive))
      break;
    if (false == archive.ReadInt(&m_edge_count))
      break;
    if (false == this->m_edge_hash.Read(archive))
      break;
    if (false == archive.ReadInt(&m_face_count))
      break;
    if (false == this->m_face_hash.Read(archive))
      break;
    rc = true;
    break;
  }

  if (false == archive.EndRead3dmChunk())
    rc = false;
  return rc;

}